

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::changeEvent(QToolButton *this,QEvent *e)

{
  Type TVar1;
  int iVar2;
  QToolButtonPrivate *e_00;
  QToolBar *pQVar3;
  QStyle *pQVar4;
  QEvent *in_RSI;
  QStyleOption *in_RDI;
  SubElement unaff_retaddr;
  QWidgetPrivate *in_stack_00000008;
  QToolButtonPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  QStyleOption *opt;
  
  opt = in_RDI;
  e_00 = d_func((QToolButton *)0x70acd1);
  TVar1 = QEvent::type(in_RSI);
  if (TVar1 == ParentChange) {
    QWidget::parentWidget((QWidget *)0x70acef);
    pQVar3 = qobject_cast<QToolBar*>((QObject *)0x70acf7);
    if (pQVar3 != (QToolBar *)0x0) {
      e_00->field_0x2ec = e_00->field_0x2ec & 0xf7 | 8;
    }
  }
  else {
    TVar1 = QEvent::type(in_RSI);
    if (TVar1 == StyleChange) {
      pQVar4 = QWidget::style(in_stack_ffffffffffffffd8);
      iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x34,0,in_RDI);
      e_00->delay = iVar2;
      QWidgetPrivate::setLayoutItemMargins(in_stack_00000008,unaff_retaddr,opt);
    }
  }
  QAbstractButton::changeEvent((QAbstractButton *)in_RSI,(QEvent *)e_00);
  return;
}

Assistant:

void QToolButton::changeEvent(QEvent *e)
{
#if QT_CONFIG(toolbar)
    Q_D(QToolButton);
    if (e->type() == QEvent::ParentChange) {
        if (qobject_cast<QToolBar*>(parentWidget()))
            d->autoRaise = true;
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->delay = style()->styleHint(QStyle::SH_ToolButton_PopupDelay, nullptr, this);
        d->setLayoutItemMargins(QStyle::SE_ToolButtonLayoutItem);
    }
#endif
    QAbstractButton::changeEvent(e);
}